

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureBufferActiveUniformValidation.cpp
# Opt level: O0

IterateResult __thiscall
glcts::TextureBufferActiveUniformValidation::iterate(TextureBufferActiveUniformValidation *this)

{
  allocator<unsigned_int> *this_00;
  GLuint GVar1;
  mapped_type mVar2;
  code *pcVar3;
  uint uVar4;
  uint uVar5;
  bool bVar6;
  int iVar7;
  deUint32 dVar8;
  GLenum GVar9;
  GLenum GVar10;
  RenderContext *pRVar11;
  undefined4 extraout_var;
  ulong uVar12;
  size_type sVar13;
  TestLog *pTVar14;
  MessageBuilder *pMVar15;
  reference pvVar16;
  char *__s2;
  mapped_type *pmVar17;
  pointer ppVar18;
  reference pvVar19;
  reference pvVar20;
  reference pvVar21;
  GLenum *pGVar22;
  char *local_aa0;
  char *local_a98;
  MessageBuilder local_a90;
  key_type local_90c;
  mapped_type local_908;
  GLuint i_4;
  GLint type;
  GLenum paramVal;
  char *local_8f8;
  MessageBuilder local_8f0;
  key_type local_76c;
  uint local_768;
  GLuint i_3;
  GLuint i_2;
  vector<int,_std::allocator<int>_> types;
  undefined1 local_740 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> indicies;
  MessageBuilder local_720;
  _Self local_5a0;
  _Self local_598;
  _Self local_590;
  iterator it;
  reference pvStack_580;
  GLuint i_1;
  string local_578;
  char *local_558;
  char *local_550;
  MessageBuilder local_548;
  string local_3c8;
  char *local_3a8;
  MessageBuilder local_3a0;
  TextureParameters *local_220;
  TextureParameters *param;
  undefined1 local_210 [4];
  GLuint i;
  map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  resultTypes;
  GLenum uniformType;
  GLsizei uniformSize;
  GLsizei paramLength;
  vector<char,_std::allocator<char>_> nameValue;
  MessageBuilder local_1a0;
  uint local_20;
  byte local_19;
  GLint n_active_uniforms;
  bool testResult;
  Functions *gl;
  TextureBufferActiveUniformValidation *this_local;
  
  gl = (Functions *)this;
  (*(this->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode[8])();
  pRVar11 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
  iVar7 = (*pRVar11->_vptr_RenderContext[3])();
  _n_active_uniforms = CONCAT44(extraout_var,iVar7);
  local_19 = 1;
  (**(code **)(_n_active_uniforms + 0x1680))(this->m_po_id);
  dVar8 = (**(code **)(_n_active_uniforms + 0x800))();
  glu::checkError(dVar8,"Error setting active program object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferActiveUniformValidation.cpp"
                  ,0xe3);
  (*(this->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode[6])
            (this,&this->m_texture_params,this->m_tbo_tex_ids);
  (**(code **)(_n_active_uniforms + 0x9d8))(this->m_po_id,0x8b86,&local_20);
  dVar8 = (**(code **)(_n_active_uniforms + 0x800))();
  glu::checkError(dVar8,"Error getting value of GL_ACTIVE_UNIFORMS!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferActiveUniformValidation.cpp"
                  ,0xec);
  uVar12 = (ulong)local_20;
  sVar13 = std::vector<glcts::TextureParameters,_std::allocator<glcts::TextureParameters>_>::size
                     (&this->m_texture_params);
  if (uVar12 != sVar13) {
    pTVar14 = tcu::TestContext::getLog
                        ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_1a0,pTVar14,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar15 = tcu::MessageBuilder::operator<<
                        (&local_1a0,(char (*) [36])"Result is different than expected!\n");
    pMVar15 = tcu::MessageBuilder::operator<<
                        (pMVar15,(char (*) [37])"Expected number of active uniforms: ");
    nameValue.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_ =
         std::vector<glcts::TextureParameters,_std::allocator<glcts::TextureParameters>_>::size
                   (&this->m_texture_params);
    pMVar15 = tcu::MessageBuilder::operator<<
                        (pMVar15,(unsigned_long *)
                                 &nameValue.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                  field_0x10);
    pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,(char (*) [2])0x2b8f97b);
    pMVar15 = tcu::MessageBuilder::operator<<
                        (pMVar15,(char (*) [37])"Result   number of active uniforms: ");
    pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,(int *)&local_20);
    pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,(char (*) [2])0x2b8f97b);
    tcu::MessageBuilder::operator<<(pMVar15,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1a0);
    local_19 = 0;
  }
  std::allocator<char>::allocator();
  std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)&paramLength,100,
             (allocator_type *)((long)&uniformSize + 3));
  std::allocator<char>::~allocator((allocator<char> *)((long)&uniformSize + 3));
  uniformType = 0;
  resultTypes._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 0;
  std::
  map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  ::map((map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
         *)local_210);
  for (param._4_4_ = 0; uVar4 = param._4_4_, param._4_4_ < local_20; param._4_4_ = param._4_4_ + 1)
  {
    pcVar3 = *(code **)(_n_active_uniforms + 0x750);
    GVar1 = this->m_po_id;
    pvVar16 = std::vector<char,_std::allocator<char>_>::operator[]
                        ((vector<char,_std::allocator<char>_> *)&paramLength,0);
    (*pcVar3)(GVar1,uVar4,99,&uniformType,
              (undefined1 *)
              ((long)&resultTypes._M_t._M_impl.super__Rb_tree_header._M_node_count + 4),
              &resultTypes._M_t._M_impl.super__Rb_tree_header._M_node_count,pvVar16);
    dVar8 = (**(code **)(_n_active_uniforms + 0x800))();
    glu::checkError(dVar8,"Error getting information about active uniform variable!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferActiveUniformValidation.cpp"
                    ,0x106);
    local_220 = getParamsForType(this,(mapped_type)
                                      resultTypes._M_t._M_impl.super__Rb_tree_header._M_node_count);
    if (local_220 == (TextureParameters *)0x0) {
      pTVar14 = tcu::TestContext::getLog
                          ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<(&local_3a0,pTVar14,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar15 = tcu::MessageBuilder::operator<<
                          (&local_3a0,
                           (char (*) [77])
                           "Following uniform type was not expected to be defined in current program : \n"
                          );
      local_3a8 = getUniformTypeName(this,(mapped_type)
                                          resultTypes._M_t._M_impl.super__Rb_tree_header.
                                          _M_node_count);
      pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,&local_3a8);
      pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,(char (*) [2])0x2b8f97b);
      tcu::MessageBuilder::operator<<(pMVar15,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_3a0);
      local_19 = 0;
    }
    else {
      pvVar16 = std::vector<char,_std::allocator<char>_>::operator[]
                          ((vector<char,_std::allocator<char>_> *)&paramLength,0);
      TextureParameters::get_uniform_name_abi_cxx11_(&local_3c8,local_220);
      __s2 = (char *)std::__cxx11::string::c_str();
      iVar7 = strncmp(pvVar16,__s2,100);
      std::__cxx11::string::~string((string *)&local_3c8);
      if (iVar7 != 0) {
        pTVar14 = tcu::TestContext::getLog
                            ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
        tcu::TestLog::operator<<(&local_548,pTVar14,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar15 = tcu::MessageBuilder::operator<<(&local_548,(char (*) [6])"For :");
        local_550 = getUniformTypeName(this,(mapped_type)
                                            resultTypes._M_t._M_impl.super__Rb_tree_header.
                                            _M_node_count);
        pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,&local_550);
        pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,(char (*) [13])" type name \n");
        pMVar15 = tcu::MessageBuilder::operator<<
                            (pMVar15,(char (*) [28])"expected  uniform name is: ");
        TextureParameters::get_uniform_name_abi_cxx11_(&local_578,local_220);
        local_558 = (char *)std::__cxx11::string::c_str();
        pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,&local_558);
        pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,(char (*) [2])0x2b8f97b);
        pMVar15 = tcu::MessageBuilder::operator<<
                            (pMVar15,(char (*) [28])"result    uniform name is: ");
        pvStack_580 = std::vector<char,_std::allocator<char>_>::operator[]
                                ((vector<char,_std::allocator<char>_> *)&paramLength,0);
        pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,&stack0xfffffffffffffa80);
        pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,(char (*) [2])0x2b8f97b);
        tcu::MessageBuilder::operator<<(pMVar15,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::string::~string((string *)&local_578);
        tcu::MessageBuilder::~MessageBuilder(&local_548);
        local_19 = 0;
      }
    }
    mVar2 = (mapped_type)resultTypes._M_t._M_impl.super__Rb_tree_header._M_node_count;
    pmVar17 = std::
              map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
              ::operator[]((map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                            *)local_210,(key_type *)((long)&param + 4));
    *pmVar17 = mVar2;
  }
  it._M_node._4_4_ = 0;
  do {
    if (local_20 <= it._M_node._4_4_) {
      sVar13 = (size_type)(int)local_20;
      this_00 = (allocator<unsigned_int> *)
                ((long)&types.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage + 7);
      std::allocator<unsigned_int>::allocator(this_00);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_740,sVar13,this_00);
      std::allocator<unsigned_int>::~allocator
                ((allocator<unsigned_int> *)
                 ((long)&types.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage + 7));
      sVar13 = (size_type)(int)local_20;
      std::allocator<int>::allocator((allocator<int> *)((long)&i_3 + 3));
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)&i_2,sVar13,(allocator<int> *)((long)&i_3 + 3)
                );
      std::allocator<int>::~allocator((allocator<int> *)((long)&i_3 + 3));
      for (local_768 = 0; uVar5 = local_20, uVar4 = local_768, local_768 < local_20;
          local_768 = local_768 + 1) {
        pvVar20 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_740,
                             (ulong)local_768);
        *pvVar20 = uVar4;
      }
      pcVar3 = *(code **)(_n_active_uniforms + 0x770);
      GVar1 = this->m_po_id;
      pvVar20 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_740,0);
      pvVar21 = std::vector<int,_std::allocator<int>_>::operator[]
                          ((vector<int,_std::allocator<int>_> *)&i_2,0);
      (*pcVar3)(GVar1,uVar5,pvVar20,0x8a37,pvVar21);
      dVar8 = (**(code **)(_n_active_uniforms + 0x800))();
      glu::checkError(dVar8,"Error getting information about active uniform variables!",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferActiveUniformValidation.cpp"
                      ,0x142);
      for (local_76c = 0; local_76c < local_20; local_76c = local_76c + 1) {
        pmVar17 = std::
                  map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                  ::operator[]((map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                                *)local_210,&local_76c);
        mVar2 = *pmVar17;
        pmVar17 = (mapped_type *)
                  std::vector<int,_std::allocator<int>_>::operator[]
                            ((vector<int,_std::allocator<int>_> *)&i_2,(ulong)local_76c);
        if (mVar2 != *pmVar17) {
          pTVar14 = tcu::TestContext::getLog
                              ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
          tcu::TestLog::operator<<(&local_8f0,pTVar14,(BeginMessageToken *)&tcu::TestLog::Message);
          pMVar15 = tcu::MessageBuilder::operator<<
                              (&local_8f0,(char (*) [30])"Wrong uniform type for index(");
          pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,&local_76c);
          pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,(char (*) [3])0x2c1ee60);
          pMVar15 = tcu::MessageBuilder::operator<<
                              (pMVar15,(char (*) [24])"expected uniform type: ");
          pmVar17 = std::
                    map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                    ::operator[]((map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                                  *)local_210,&local_76c);
          local_8f8 = getUniformTypeName(this,*pmVar17);
          pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,&local_8f8);
          pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,(char (*) [2])0x2b8f97b);
          pMVar15 = tcu::MessageBuilder::operator<<
                              (pMVar15,(char (*) [24])"result   uniform type: ");
          pGVar22 = (GLenum *)
                    std::vector<int,_std::allocator<int>_>::operator[]
                              ((vector<int,_std::allocator<int>_> *)&i_2,(ulong)local_76c);
          _type = getUniformTypeName(this,*pGVar22);
          pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,(char **)&type);
          pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,(char (*) [2])0x2b8f97b);
          tcu::MessageBuilder::operator<<(pMVar15,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::MessageBuilder::~MessageBuilder(&local_8f0);
          local_19 = 0;
        }
      }
      i_4 = 0x92fa;
      local_908 = 0xffffffff;
      for (local_90c = 0; local_90c < local_20; local_90c = local_90c + 1) {
        (**(code **)(_n_active_uniforms + 0x9c8))
                  (this->m_po_id,0x92e1,local_90c,1,&i_4,1,0,&local_908);
        dVar8 = (**(code **)(_n_active_uniforms + 0x800))();
        glu::checkError(dVar8,"Error getting information about one of program resources!",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferActiveUniformValidation.cpp"
                        ,0x159);
        pmVar17 = std::
                  map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                  ::operator[]((map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                                *)local_210,&local_90c);
        if (*pmVar17 != local_908) {
          pTVar14 = tcu::TestContext::getLog
                              ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
          tcu::TestLog::operator<<(&local_a90,pTVar14,(BeginMessageToken *)&tcu::TestLog::Message);
          pMVar15 = tcu::MessageBuilder::operator<<
                              (&local_a90,(char (*) [30])"Wrong uniform type for index(");
          pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,&local_90c);
          pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,(char (*) [3])0x2c1ee60);
          pMVar15 = tcu::MessageBuilder::operator<<
                              (pMVar15,(char (*) [24])"expected uniform type: ");
          pmVar17 = std::
                    map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                    ::operator[]((map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                                  *)local_210,&local_90c);
          local_a98 = getUniformTypeName(this,*pmVar17);
          pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,&local_a98);
          pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,(char (*) [2])0x2b8f97b);
          pMVar15 = tcu::MessageBuilder::operator<<
                              (pMVar15,(char (*) [24])"result   uniform type: ");
          local_aa0 = getUniformTypeName(this,local_908);
          pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,&local_aa0);
          pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,(char (*) [2])0x2b8f97b);
          tcu::MessageBuilder::operator<<(pMVar15,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::MessageBuilder::~MessageBuilder(&local_a90);
          local_19 = 0;
        }
      }
      if ((local_19 & 1) == 0) {
        tcu::TestContext::setTestResult
                  ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_FAIL,"Fail");
      }
      else {
        tcu::TestContext::setTestResult
                  ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_PASS,"Pass");
      }
      std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)&i_2);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_740);
      std::
      map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
      ::~map((map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
              *)local_210);
      std::vector<char,_std::allocator<char>_>::~vector
                ((vector<char,_std::allocator<char>_> *)&paramLength);
      return STOP;
    }
    local_590._M_node =
         (_Base_ptr)
         std::
         map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
         ::begin((map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                  *)local_210);
    while( true ) {
      local_598._M_node =
           (_Base_ptr)
           std::
           map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
           ::end((map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                  *)local_210);
      bVar6 = std::operator!=(&local_590,&local_598);
      if (!bVar6) break;
      ppVar18 = std::_Rb_tree_iterator<std::pair<const_unsigned_int,_unsigned_int>_>::operator->
                          (&local_590);
      GVar10 = ppVar18->second;
      pvVar19 = std::vector<glcts::TextureParameters,_std::allocator<glcts::TextureParameters>_>::
                operator[](&this->m_texture_params,(ulong)it._M_node._4_4_);
      GVar9 = TextureParameters::get_texture_uniform_type(pvVar19);
      if (GVar10 == GVar9) break;
      std::_Rb_tree_iterator<std::pair<const_unsigned_int,_unsigned_int>_>::operator++(&local_590);
    }
    local_5a0._M_node =
         (_Base_ptr)
         std::
         map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
         ::end((map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                *)local_210);
    bVar6 = std::operator==(&local_590,&local_5a0);
    if (bVar6) {
      pTVar14 = tcu::TestContext::getLog
                          ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<(&local_720,pTVar14,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar15 = tcu::MessageBuilder::operator<<
                          (&local_720,
                           (char (*) [62])
                           "Following uniform type is missing from active uniforms list: ");
      pvVar19 = std::vector<glcts::TextureParameters,_std::allocator<glcts::TextureParameters>_>::
                operator[](&this->m_texture_params,(ulong)it._M_node._4_4_);
      GVar10 = TextureParameters::get_texture_uniform_type(pvVar19);
      indicies.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)getUniformTypeName(this,GVar10);
      pMVar15 = tcu::MessageBuilder::operator<<
                          (pMVar15,(char **)&indicies.
                                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
      pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,(char (*) [2])0x2b8f97b);
      tcu::MessageBuilder::operator<<(pMVar15,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_720);
      local_19 = 0;
    }
    it._M_node._4_4_ = it._M_node._4_4_ + 1;
  } while( true );
}

Assistant:

tcu::TestNode::IterateResult TextureBufferActiveUniformValidation::iterate(void)
{
	/* Initialize */
	initTest();

	/* Get GL entry points */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	bool testResult = true;

	gl.useProgram(m_po_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error setting active program object!");

	/* Configure Program */
	configureProgram(&m_texture_params, m_tbo_tex_ids);

	/* Get number of active uniforms for current program */
	glw::GLint n_active_uniforms;

	gl.getProgramiv(m_po_id, GL_ACTIVE_UNIFORMS, &n_active_uniforms);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error getting value of GL_ACTIVE_UNIFORMS!");

	if ((glw::GLuint)n_active_uniforms != m_texture_params.size())
	{
		/* Log error if number of active uniforms different than expected */
		m_testCtx.getLog() << tcu::TestLog::Message << "Result is different than expected!\n"
						   << "Expected number of active uniforms: " << m_texture_params.size() << "\n"
						   << "Result   number of active uniforms: " << n_active_uniforms << "\n"
						   << tcu::TestLog::EndMessage;

		testResult = false;
	}

	/* Retrieve parameters for specific indices */
	std::vector<glw::GLchar> nameValue(m_param_value_size);
	glw::GLsizei			 paramLength = 0;
	glw::GLsizei			 uniformSize = 0;
	glw::GLenum				 uniformType;

	/* store map of indices and uniform types */
	std::map<glw::GLuint, glw::GLenum> resultTypes;

	for (glw::GLuint i = 0; i < (glw::GLuint)n_active_uniforms; ++i)
	{
		gl.getActiveUniform(m_po_id, i /* index */, (glw::GLsizei)(m_param_value_size - 1), &paramLength, &uniformSize,
							&uniformType, &nameValue[0]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Error getting information about active uniform variable!");

		/*Check if returned uniform type is one of types defined in current program*/
		const TextureParameters* param = getParamsForType(uniformType);

		if (0 == param)
		{
			m_testCtx.getLog() << tcu::TestLog::Message
							   << "Following uniform type was not expected to be defined in current program : \n"
							   << getUniformTypeName(uniformType) << "\n"
							   << tcu::TestLog::EndMessage;
			testResult = false;
		}
		else if (strncmp(&nameValue[0], param->get_uniform_name().c_str(), m_param_value_size))
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "For :" << getUniformTypeName(uniformType) << " type name \n"
							   << "expected  uniform name is: " << param->get_uniform_name().c_str() << "\n"
							   << "result    uniform name is: " << &nameValue[0] << "\n"
							   << tcu::TestLog::EndMessage;
			testResult = false;
		}

		resultTypes[i] = uniformType;
	}

	/* Check if all uniform types defined in program were returned */
	for (glw::GLuint i = 0; i < (glw::GLuint)n_active_uniforms; ++i)
	{
		/* Log error if expected uniform type is missing */
		std::map<glw::GLuint, glw::GLenum>::iterator it = resultTypes.begin();
		for (; it != resultTypes.end(); ++it)
		{
			if (it->second == m_texture_params[i].get_texture_uniform_type())
			{
				break;
			}
		}

		/* Log if there is some missing uniform type */
		if (it == resultTypes.end())
		{
			m_testCtx.getLog() << tcu::TestLog::Message
							   << "Following uniform type is missing from active uniforms list: "
							   << getUniformTypeName(m_texture_params[i].get_texture_uniform_type()) << "\n"
							   << tcu::TestLog::EndMessage;

			testResult = false;
		}
	}

	/* Get all active uniform types using glGetActiveUniformsiv and compare with results from glGetActiveUniform function */
	std::vector<glw::GLuint> indicies(n_active_uniforms);
	std::vector<glw::GLint>  types(n_active_uniforms);

	for (glw::GLuint i = 0; i < (glw::GLuint)n_active_uniforms; ++i)
	{
		indicies[i] = i;
	}

	gl.getActiveUniformsiv(m_po_id, n_active_uniforms, &indicies[0], GL_UNIFORM_TYPE, &types[0]);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error getting information about active uniform variables!");

	for (glw::GLuint i = 0; i < (glw::GLuint)n_active_uniforms; ++i)
	{
		/* Log error if expected result is different from expected*/
		if (resultTypes[i] != (glw::GLuint)types[i])
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Wrong uniform type for index(" << i << ")\n"
							   << "expected uniform type: " << getUniformTypeName(resultTypes[i]) << "\n"
							   << "result   uniform type: " << getUniformTypeName(types[i]) << "\n"
							   << tcu::TestLog::EndMessage;

			testResult = false;
		}
	}

	glw::GLenum paramVal = GL_TYPE;
	glw::GLint  type	 = -1;

	for (glw::GLuint i = 0; i < (glw::GLuint)n_active_uniforms; ++i)
	{
		gl.getProgramResourceiv(m_po_id, GL_UNIFORM, i /*index */, 1 /* parameters count */,
								&paramVal /* parameter enum */, 1 /* buffer size */, 0, &type);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Error getting information about one of program resources!");

		if (resultTypes[i] != (glw::GLuint)type)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Wrong uniform type for index(" << i << ")\n"
							   << "expected uniform type: " << getUniformTypeName(resultTypes[i]) << "\n"
							   << "result   uniform type: " << getUniformTypeName(type) << "\n"
							   << tcu::TestLog::EndMessage;
			testResult = false;
		}
	}

	if (testResult)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	return STOP;
}